

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::OneHotEncoder::ByteSizeLong(OneHotEncoder *this)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = (size_t)((uint)this->outputsparse_ * 2);
  if (this->handleunknown_ != 0) {
    sVar1 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->handleunknown_);
    sVar2 = sVar2 + sVar1 + 1;
  }
  if (this->_oneof_case_[0] == 2) {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                      ((this->CategoryType_).int64categories_);
  }
  else {
    if (this->_oneof_case_[0] != 1) goto LAB_0020513d;
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>
                      ((this->CategoryType_).stringcategories_);
  }
  sVar2 = sVar2 + sVar1 + 1;
LAB_0020513d:
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t OneHotEncoder::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.OneHotEncoder)
  size_t total_size = 0;

  // bool outputSparse = 10;
  if (this->outputsparse() != 0) {
    total_size += 1 + 1;
  }

  // .CoreML.Specification.OneHotEncoder.HandleUnknown handleUnknown = 11;
  if (this->handleunknown() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->handleunknown());
  }

  switch (CategoryType_case()) {
    // .CoreML.Specification.StringVector stringCategories = 1;
    case kStringCategories: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *CategoryType_.stringcategories_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64Categories = 2;
    case kInt64Categories: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *CategoryType_.int64categories_);
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}